

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::LoopExpr::~LoopExpr(LoopExpr *this)

{
  ~LoopExpr(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

LoopExpr::~LoopExpr() {
}